

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O2

FloatMarkerData * __thiscall
C3DFile::getMarkerTrajectories
          (FloatMarkerData *__return_storage_ptr__,C3DFile *this,char *point_name_str)

{
  iterator iVar1;
  ulong uVar2;
  ostream *poVar3;
  string marker_name;
  allocator<char> local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&marker_name,point_name_str,local_40)
  ;
  std::__cxx11::string::find_last_not_of((char *)&marker_name,0x10b75a);
  std::__cxx11::string::substr((ulong)local_40,(ulong)&marker_name);
  std::__cxx11::string::operator=((string *)&marker_name,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
          ::find(&(this->label_point_map)._M_t,&marker_name);
  if ((_Rb_tree_header *)iVar1._M_node ==
      &(this->label_point_map)._M_t._M_impl.super__Rb_tree_header) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: could not find marker with name \'");
    poVar3 = std::operator<<(poVar3,(string *)&marker_name);
    poVar3 = std::operator<<(poVar3,"\'!");
    std::endl<char,std::char_traits<char>>(poVar3);
    abort();
  }
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
          ::find(&(this->label_point_map)._M_t,&marker_name);
  uVar2 = (ulong)(ushort)(short)iVar1._M_node[2]._M_color;
  if (uVar2 < 0xff) {
    FloatMarkerData::FloatMarkerData
              (__return_storage_ptr__,
               (this->float_point_data).
               super__Vector_base<FloatMarkerData,_std::allocator<FloatMarkerData>_>._M_impl.
               super__Vector_impl_data._M_start + uVar2);
    std::__cxx11::string::~string((string *)&marker_name);
    return __return_storage_ptr__;
  }
  __assert_fail("index >= 0 && index < 255",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                ,0x30,"FloatMarkerData C3DFile::getMarkerTrajectories(const char *)");
}

Assistant:

FloatMarkerData C3DFile::getMarkerTrajectories (const char* point_name_str) {
	std::string marker_name(point_name_str);
	
	marker_name = marker_name.substr(0, marker_name.find_last_not_of(" ") + 1);

	if (label_point_map.find(marker_name) == label_point_map.end()) {
		cerr << "Error: could not find marker with name '" << marker_name << "'!" << endl;
		abort();
	}

	Sint16 index = label_point_map.find(marker_name)->second;

	assert (index >= 0 && index < 255);

	return float_point_data[index];
}